

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

SRes crnlib::Flush(CLzmaEnc *p,UInt32 nowPos)

{
  CRangeEnc *p_00;
  SRes SVar1;
  int iVar2;
  uint posState;
  bool bVar3;
  
  p->finished = 1;
  if (p->writeEndMark != 0) {
    posState = nowPos & p->pbMask;
    p_00 = &p->rc;
    RangeEnc_EncodeBit(p_00,p->isMatch[p->state] + posState,1);
    RangeEnc_EncodeBit(p_00,p->isRep + p->state,0);
    p->state = *(UInt32 *)(kMatchNextStates + (ulong)p->state * 4);
    LenEnc_Encode2(&p->lenEnc,p_00,0,posState,(uint)(p->fastMode == 0),p->ProbPrices);
    RcTree_Encode(p_00,p->posSlotEncoder[0],6,0x3f);
    RangeEnc_EncodeDirectBits(p_00,0x3ffffff,0x1a);
    RcTree_ReverseEncode(p_00,p->posAlignEncoder,4,0xf);
  }
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    RangeEnc_ShiftLow(&p->rc);
  }
  RangeEnc_FlushStream(&p->rc);
  SVar1 = CheckErrors(p);
  return SVar1;
}

Assistant:

static SRes Flush(CLzmaEnc* p, UInt32 nowPos) {
  /* ReleaseMFStream(); */
  p->finished = True;
  if (p->writeEndMark)
    WriteEndMarker(p, nowPos & p->pbMask);
  RangeEnc_FlushData(&p->rc);
  RangeEnc_FlushStream(&p->rc);
  return CheckErrors(p);
}